

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O3

DecodeStatus DecodeL2RUSInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *Op3_00;
  uint Op3;
  uint Op2;
  uint Op1;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  Op3_00 = &local_24;
  DVar1 = Decode3OpInstruction(Insn & 0xffff,&local_1c,&local_20,Op3_00);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(Inst,local_1c,Address,Op3_00);
    DecodeGRRegsRegisterClass(Inst,local_20,Address,Op3_00);
    MCOperand_CreateImm0(Inst,(ulong)local_24);
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL2RUSInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2, Op3;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		MCOperand_CreateImm0(Inst, Op3);
	}

	return S;
}